

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O0

int JacB(sunrealtype tt,sunrealtype cj,N_Vector yy,N_Vector yp,N_Vector yyB,N_Vector ypB,
        N_Vector rrB,SUNMatrix JB,void *user_data,N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  sunrealtype y3;
  sunrealtype y2;
  SUNMatrix JB_local;
  N_Vector rrB_local;
  N_Vector ypB_local;
  N_Vector yyB_local;
  N_Vector yp_local;
  N_Vector yy_local;
  sunrealtype cj_local;
  sunrealtype tt_local;
  
  dVar1 = *(double *)(*(long *)((long)yy->content + 0x10) + 8);
  dVar2 = *(double *)(*(long *)((long)yy->content + 0x10) + 0x10);
  dVar3 = *user_data;
  dVar4 = *(double *)((long)user_data + 8);
  dVar5 = *(double *)((long)user_data + 0x10);
  *(double *)**(undefined8 **)((long)JB->content + 0x20) = -dVar3 + cj;
  **(double **)(*(long *)((long)JB->content + 0x20) + 8) = dVar3;
  **(undefined8 **)(*(long *)((long)JB->content + 0x20) + 0x10) = 0xbff0000000000000;
  *(double *)(**(long **)((long)JB->content + 0x20) + 8) = dVar4 * dVar2;
  *(double *)(*(long *)(*(long *)((long)JB->content + 0x20) + 8) + 8) =
       -(dVar4 * dVar2 + dVar5 * 2.0 * dVar1) + cj;
  *(undefined8 *)(*(long *)(*(long *)((long)JB->content + 0x20) + 0x10) + 8) = 0xbff0000000000000;
  *(double *)(**(long **)((long)JB->content + 0x20) + 0x10) = dVar4 * dVar1;
  *(double *)(*(long *)(*(long *)((long)JB->content + 0x20) + 8) + 0x10) = -dVar4 * dVar1;
  *(undefined8 *)(*(long *)(*(long *)((long)JB->content + 0x20) + 0x10) + 0x10) = 0xbff0000000000000
  ;
  return 0;
}

Assistant:

static int JacB(sunrealtype tt, sunrealtype cj, N_Vector yy, N_Vector yp,
                N_Vector yyB, N_Vector ypB, N_Vector rrB, SUNMatrix JB,
                void* user_data, N_Vector tmp1B, N_Vector tmp2B, N_Vector tmp3B)
{
  sunrealtype y2, y3;
  UserData data;
  sunrealtype p1, p2, p3;

  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  IJth(JB, 1, 1) = -p1 + cj;
  IJth(JB, 1, 2) = p1;
  IJth(JB, 1, 3) = -ONE;

  IJth(JB, 2, 1) = p2 * y3;
  IJth(JB, 2, 2) = -(p2 * y3 + SUN_RCONST(2.0) * p3 * y2) + cj;
  IJth(JB, 2, 3) = -ONE;

  IJth(JB, 3, 1) = p2 * y2;
  IJth(JB, 3, 2) = -p2 * y2;
  IJth(JB, 3, 3) = -ONE;

  return (0);
}